

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LoadHelperTemp(Lowerer *this,Instr *instr,Instr *instrInsert)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  StackSym *sym;
  Instr *pIVar5;
  
  this_00 = instr->m_dst;
  if (this_00 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2109,"(dst != nullptr)","Always expect a dst for these.");
    if (!bVar2) goto LAB_005ce959;
    *puVar4 = 0;
  }
  if ((instr->field_0x36 & 2) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x210a,"(instr->dstIsTempNumber)","Should only be loading temps here");
    if (!bVar2) goto LAB_005ce959;
    *puVar4 = 0;
  }
  OVar3 = IR::Opnd::GetKind(this_00);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x210c,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
    if (!bVar2) {
LAB_005ce959:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  sym = GetTempNumberSym(this,this_00,SUB41((*(ushort *)&instr->field_0x36 & 4) >> 2,0));
  pIVar5 = InsertLoadStackAddress(this,sym,instrInsert,(RegOpnd *)0x0);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instrInsert,pIVar5->m_dst);
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::LoadHelperTemp(IR::Instr * instr, IR::Instr * instrInsert)
{
    IR::Opnd *tempOpnd;
    IR::Opnd *dst = instr->GetDst();
    AssertMsg(dst != nullptr, "Always expect a dst for these.");
    AssertMsg(instr->dstIsTempNumber, "Should only be loading temps here");

    Assert(dst->IsRegOpnd());
    StackSym * tempNumberSym = this->GetTempNumberSym(dst, instr->dstIsTempNumberTransferred);

    IR::Instr *load = InsertLoadStackAddress(tempNumberSym, instrInsert);
    tempOpnd = load->GetDst();
    m_lowererMD.LoadHelperArgument(instrInsert, tempOpnd);
    return load;
}